

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSemaphore.cpp
# Opt level: O2

void __thiscall de::Semaphore::Semaphore(Semaphore *this,int initialValue,deUint32 flags)

{
  deSemaphore dVar1;
  undefined8 *puVar2;
  deSemaphoreAttributes local_c;
  
  local_c.flags = flags;
  dVar1 = deSemaphore_create(initialValue,&local_c);
  this->m_semaphore = dVar1;
  if (dVar1 != 0) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = clock_gettime;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

Semaphore::Semaphore (int initialValue, deUint32 flags)
{
	deSemaphoreAttributes attribs;
	deMemset(&attribs, 0, sizeof(attribs));
	attribs.flags = flags;

	m_semaphore = deSemaphore_create(initialValue, &attribs);
	if (!m_semaphore)
		throw std::bad_alloc();
}